

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O1

ch_string * ch_concatstring(ch_context *vm,ch_string *left,ch_string *right)

{
  uint uVar1;
  uint uVar2;
  char *value;
  ch_string *pcVar3;
  ulong size;
  
  uVar1 = left->size;
  uVar2 = right->size;
  size = (ulong)(uVar1 + uVar2);
  value = (char *)malloc(size + 1);
  memcpy(value,left->value,(ulong)uVar1);
  memcpy(value + uVar1,right->value,(ulong)uVar2);
  value[size] = '\0';
  pcVar3 = register_allocated_string(vm,value,size);
  return pcVar3;
}

Assistant:

ch_string *ch_concatstring(ch_context *vm, ch_string* left, ch_string* right) {
  size_t size = left->size + right->size;
  char *value = (char*) malloc(size + 1);
  memcpy(value, left->value, left->size);
  memcpy(value + left->size, right->value, right->size);
  value[size] = '\0';

  return register_allocated_string(vm, value, size);
}